

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O1

void __thiscall cubeb_resampler_one_way_Test::TestBody(cubeb_resampler_one_way_Test *this)

{
  uint source_rate;
  uint target_rate;
  uint channels;
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  
  channels = 1;
  do {
    lVar2 = 0;
    do {
      source_rate = sample_rates[lVar2];
      lVar1 = 0;
      do {
        target_rate = sample_rates[lVar1];
        uVar4 = 0;
        do {
          uVar3 = (int)uVar4 + 10;
          uVar4 = (ulong)uVar3;
          fprintf(_stderr,
                  "one_way: channels: %d, source_rate: %d, dest_rate: %d, chunk_duration: %d\n",
                  (ulong)channels,(ulong)source_rate,(ulong)target_rate,uVar4);
          test_resampler_one_way<float>(channels,source_rate,target_rate,(float)(int)uVar3);
        } while (uVar3 < 0x14);
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    channels = channels + 1;
  } while (channels != 3);
  return;
}

Assistant:

TEST(cubeb, resampler_one_way)
{
  /* Test one way resamplers */
  for (uint32_t channels = 1; channels <= max_channels; channels++) {
    for (uint32_t source_rate = 0; source_rate < array_size(sample_rates); source_rate++) {
      for (uint32_t dest_rate = 0; dest_rate < array_size(sample_rates); dest_rate++) {
        for (uint32_t chunk_duration = min_chunks; chunk_duration < max_chunks; chunk_duration+=chunk_increment) {
          fprintf(stderr, "one_way: channels: %d, source_rate: %d, dest_rate: %d, chunk_duration: %d\n",
                  channels, sample_rates[source_rate], sample_rates[dest_rate], chunk_duration);
          test_resampler_one_way<float>(channels, sample_rates[source_rate],
                                        sample_rates[dest_rate], chunk_duration);
        }
      }
    }
  }
}